

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

void __thiscall duckdb::AlpCompressionState<float>::CompressVector(AlpCompressionState<float> *this)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  bool bVar3;
  pointer pCVar4;
  idx_t iVar5;
  idx_t i;
  ulong uVar6;
  
  if (this->nulls_idx == 0) {
    iVar5 = 0;
  }
  else {
    alp::AlpUtils::FindAndReplaceNullsInVector<float>
              (this->input_vector,this->vector_null_positions,this->vector_idx,this->nulls_idx);
    iVar5 = this->nulls_idx;
  }
  alp::AlpCompression<float,_false>::Compress
            (this->input_vector,this->vector_idx,this->vector_null_positions,iVar5,&this->state);
  bVar3 = HasEnoughSpace(this);
  if (!bVar3) {
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar5 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var2 = (pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var2 + iVar5);
  }
  iVar5 = this->vector_idx;
  if (iVar5 != this->nulls_idx) {
    for (uVar6 = 0; uVar6 < iVar5; uVar6 = uVar6 + 1) {
      pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      NumericStats::Update<float>
                (&(pCVar4->stats).statistics.stats_union.numeric_data,this->input_vector[uVar6]);
      iVar5 = this->vector_idx;
    }
  }
  pCVar4 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar4->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + iVar5;
  UNLOCK();
  FlushVector(this);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<T>(input_vector, vector_null_positions, vector_idx, nulls_idx);
		}
		alp::AlpCompression<T, false>::Compress(input_vector, vector_idx, vector_null_positions, nulls_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}

		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				current_segment->stats.statistics.UpdateNumericStats<T>(input_vector[i]);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}